

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

void __thiscall
libtorrent::dht::node::get_item
          (node *this,public_key *pk,string *salt,
          function<void_(const_libtorrent::dht::item_&,_bool)> *f)

{
  dht_observer *pdVar1;
  int iVar2;
  function<void_(const_libtorrent::dht::item_&,_bool)> *out;
  span<const_char> in;
  shared_ptr<libtorrent::dht::get_item> ta;
  char hex_key [65];
  undefined1 local_89;
  long *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  _Any_data local_78;
  code *local_68;
  undefined8 uStack_60;
  
  pdVar1 = this->m_observer;
  if (pdVar1 != (dht_observer *)0x0) {
    out = f;
    iVar2 = (**(pdVar1->super_dht_logger)._vptr_dht_logger)(pdVar1,1);
    if ((char)iVar2 != '\0') {
      in.m_len = (difference_type)&local_78;
      in.m_ptr = (char *)0x20;
      aux::to_hex((aux *)pk,in,(char *)out);
      (*(this->m_observer->super_dht_logger)._vptr_dht_logger[1])
                (this->m_observer,1,"starting get for [ key: %s ]",&local_78);
    }
  }
  local_68 = (code *)0x0;
  uStack_60 = 0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  ::std::__shared_ptr<libtorrent::dht::get_item,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<libtorrent::dht::get_item>,libtorrent::dht::node&,libtorrent::dht::public_key_const&,std::__cxx11::string_const&,std::function<void(libtorrent::dht::item_const&,bool)>,std::function<void(std::vector<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>,std::allocator<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>>>const&)>>
            ((__shared_ptr<libtorrent::dht::get_item,(__gnu_cxx::_Lock_policy)2> *)&local_88,
             (allocator<libtorrent::dht::get_item> *)&local_89,this,pk,salt,f,
             (function<void_(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
              *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  (**(code **)(*local_88 + 0x18))();
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  return;
}

Assistant:

void node::get_item(public_key const& pk, std::string const& salt
	, std::function<void(item const&, bool)> f)
{
#ifndef TORRENT_DISABLE_LOGGING
	if (m_observer != nullptr && m_observer->should_log(dht_logger::node))
	{
		char hex_key[65];
		aux::to_hex(pk.bytes, hex_key);
		m_observer->log(dht_logger::node, "starting get for [ key: %s ]", hex_key);
	}
#endif

	auto ta = std::make_shared<dht::get_item>(*this, pk, salt, std::move(f)
		, find_data::nodes_callback());
	ta->start();
}